

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::DirectiveSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0xe7) {
    if ((kind - DefaultDecayTimeDirective < 0x3b) &&
       ((0x7c0120000079421U >> ((ulong)(kind - DefaultDecayTimeDirective) & 0x3f) & 1) != 0)) {
      return true;
    }
    if (kind == BeginKeywordsDirective) {
      return true;
    }
    if (kind == CellDefineDirective) {
      return true;
    }
  }
  else if ((int)kind < 0x174) {
    if ((kind - IfDefDirective < 0x40) &&
       ((0x8000040000040005U >> ((ulong)(kind - IfDefDirective) & 0x3f) & 1) != 0)) {
      return true;
    }
    if (kind == NoUnconnectedDriveDirective) {
      return true;
    }
  }
  else if (((kind - PragmaDirective < 0x20) &&
           ((0x80006001U >> (kind - PragmaDirective & 0x1f) & 1) != 0)) ||
          ((kind - TimeScaleDirective < 0x2b &&
           ((0x70000000001U >> ((ulong)(kind - TimeScaleDirective) & 0x3f) & 1) != 0)))) {
    return true;
  }
  return false;
}

Assistant:

bool DirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BeginKeywordsDirective:
        case SyntaxKind::CellDefineDirective:
        case SyntaxKind::DefaultDecayTimeDirective:
        case SyntaxKind::DefaultNetTypeDirective:
        case SyntaxKind::DefaultTriregStrengthDirective:
        case SyntaxKind::DefineDirective:
        case SyntaxKind::DelayModeDistributedDirective:
        case SyntaxKind::DelayModePathDirective:
        case SyntaxKind::DelayModeUnitDirective:
        case SyntaxKind::DelayModeZeroDirective:
        case SyntaxKind::ElsIfDirective:
        case SyntaxKind::ElseDirective:
        case SyntaxKind::EndCellDefineDirective:
        case SyntaxKind::EndIfDirective:
        case SyntaxKind::EndKeywordsDirective:
        case SyntaxKind::EndProtectDirective:
        case SyntaxKind::EndProtectedDirective:
        case SyntaxKind::IfDefDirective:
        case SyntaxKind::IfNDefDirective:
        case SyntaxKind::IncludeDirective:
        case SyntaxKind::LineDirective:
        case SyntaxKind::MacroUsage:
        case SyntaxKind::NoUnconnectedDriveDirective:
        case SyntaxKind::PragmaDirective:
        case SyntaxKind::ProtectDirective:
        case SyntaxKind::ProtectedDirective:
        case SyntaxKind::ResetAllDirective:
        case SyntaxKind::TimeScaleDirective:
        case SyntaxKind::UnconnectedDriveDirective:
        case SyntaxKind::UndefDirective:
        case SyntaxKind::UndefineAllDirective:
            return true;
        default:
            return false;
    }
}